

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_worker-inl.h
# Opt level: O2

void __thiscall spdlog::details::periodic_worker::~periodic_worker(periodic_worker *this)

{
  if ((this->worker_thread_)._M_id._M_thread != 0) {
    std::mutex::lock(&this->mutex_);
    this->active_ = false;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    std::condition_variable::notify_one();
    std::thread::join();
  }
  std::condition_variable::~condition_variable(&this->cv_);
  std::thread::~thread(&this->worker_thread_);
  return;
}

Assistant:

SPDLOG_INLINE periodic_worker::~periodic_worker()
{
    if (worker_thread_.joinable())
    {
        {
            std::lock_guard<std::mutex> lock(mutex_);
            active_ = false;
        }
        cv_.notify_one();
        worker_thread_.join();
    }
}